

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int autoIncBegin(Parse *pParse,int iDb,Table *pTab)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  sqlite3 *in_RDI;
  Table *pSeqTab;
  AutoincInfo *pInfo;
  Parse *pToplevel;
  int memId;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 uVar2;
  sqlite3 *db;
  sqlite3 *xCleanup;
  Parse *pParse_00;
  undefined8 *local_38;
  int local_24;
  
  local_24 = 0;
  if (((*(uint *)(in_RDX + 0x30) & 8) != 0) && (((ulong)in_RDI->pVfs->xOpen & 0x400000000) == 0)) {
    db = in_RDI;
    if (*(long *)(in_RDI->aLimit + 10) != 0) {
      db = *(sqlite3 **)(in_RDI->aLimit + 10);
    }
    pParse_00 = *(Parse **)
                 (*(long *)((long)in_RDI->pVfs->pAppData + (long)in_ESI * 0x20 + 0x18) + 0x68);
    if ((((pParse_00 == (Parse *)0x0) || ((pParse_00->iRangeReg & 0x80U) != 0)) ||
        (*(char *)((long)&pParse_00->nMem + 3) == '\x01')) ||
       (*(short *)((long)&pParse_00->nErr + 2) != 2)) {
      *(int *)((long)&in_RDI->flags + 4) = *(int *)((long)&in_RDI->flags + 4) + 1;
      *(undefined4 *)&in_RDI->mutex = 0x20b;
      return 0;
    }
    local_38 = *(undefined8 **)(db->aLimit + 8);
    while( true ) {
      uVar2 = false;
      if (local_38 != (undefined8 *)0x0) {
        uVar2 = local_38[1] != in_RDX;
      }
      if ((bool)uVar2 == false) break;
      local_38 = (undefined8 *)*local_38;
    }
    if (local_38 == (undefined8 *)0x0) {
      xCleanup = db;
      local_38 = (undefined8 *)sqlite3DbMallocRawNN(db,(ulong)in_stack_ffffffffffffffb0);
      sqlite3ParserAddCleanup
                (pParse_00,(_func_void_sqlite3_ptr_void_ptr *)xCleanup,
                 (void *)CONCAT17(uVar2,in_stack_ffffffffffffffb0));
      if (*(char *)((long)&in_RDI->pVfs->xDlClose + 7) != '\0') {
        return 0;
      }
      *local_38 = *(undefined8 *)(db->aLimit + 8);
      *(undefined8 **)(db->aLimit + 8) = local_38;
      local_38[1] = in_RDX;
      *(int *)(local_38 + 2) = in_ESI;
      *(int *)((long)&db->lastRowid + 4) = *(int *)((long)&db->lastRowid + 4) + 1;
      iVar1 = *(int *)((long)&db->lastRowid + 4) + 1;
      *(int *)((long)&db->lastRowid + 4) = iVar1;
      *(int *)((long)local_38 + 0x14) = iVar1;
      *(int *)((long)&db->lastRowid + 4) = *(int *)((long)&db->lastRowid + 4) + 2;
    }
    local_24 = *(int *)((long)local_38 + 0x14);
  }
  return local_24;
}

Assistant:

static int autoIncBegin(
  Parse *pParse,      /* Parsing context */
  int iDb,            /* Index of the database holding pTab */
  Table *pTab         /* The table we are writing to */
){
  int memId = 0;      /* Register holding maximum rowid */
  assert( pParse->db->aDb[iDb].pSchema!=0 );
  if( (pTab->tabFlags & TF_Autoincrement)!=0
   && (pParse->db->mDbFlags & DBFLAG_Vacuum)==0
  ){
    Parse *pToplevel = sqlite3ParseToplevel(pParse);
    AutoincInfo *pInfo;
    Table *pSeqTab = pParse->db->aDb[iDb].pSchema->pSeqTab;

    /* Verify that the sqlite_sequence table exists and is an ordinary
    ** rowid table with exactly two columns.
    ** Ticket d8dc2b3a58cd5dc2918a1d4acb 2018-05-23 */
    if( pSeqTab==0
     || !HasRowid(pSeqTab)
     || NEVER(IsVirtual(pSeqTab))
     || pSeqTab->nCol!=2
    ){
      pParse->nErr++;
      pParse->rc = SQLITE_CORRUPT_SEQUENCE;
      return 0;
    }

    pInfo = pToplevel->pAinc;
    while( pInfo && pInfo->pTab!=pTab ){ pInfo = pInfo->pNext; }
    if( pInfo==0 ){
      pInfo = sqlite3DbMallocRawNN(pParse->db, sizeof(*pInfo));
      sqlite3ParserAddCleanup(pToplevel, sqlite3DbFree, pInfo);
      testcase( pParse->earlyCleanup );
      if( pParse->db->mallocFailed ) return 0;
      pInfo->pNext = pToplevel->pAinc;
      pToplevel->pAinc = pInfo;
      pInfo->pTab = pTab;
      pInfo->iDb = iDb;
      pToplevel->nMem++;                  /* Register to hold name of table */
      pInfo->regCtr = ++pToplevel->nMem;  /* Max rowid register */
      pToplevel->nMem +=2;       /* Rowid in sqlite_sequence + orig max val */
    }
    memId = pInfo->regCtr;
  }
  return memId;
}